

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

bool __thiscall
LinearScan::ClearLoopExitIfRegUnused
          (LinearScan *this,Lifetime *lifetime,RegNum reg,BranchInstr *branchInstr,Loop *loop)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  uint32 uVar6;
  undefined4 *puVar7;
  Type *pppLVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  SList<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *pSVar10;
  Iterator local_48;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,reg);
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,ClearRegLoopExitPhase,sourceContextId,functionId);
  if (((bVar3) &&
      (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((loop->regAlloc).symRegUseBv,(lifetime->sym->super_Sym).m_id),
      BVar4 == '\0')) && ((lifetime->field_0x9d & 8) == 0)) {
    uVar1 = lifetime->end;
    uVar6 = IR::Instr::GetNumber(&branchInstr->super_Instr);
    bVar3 = true;
    if (uVar6 < uVar1) {
      pSVar10 = (loop->regAlloc).exitRegContentList;
      local_48.list = &pSVar10->super_SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>;
      local_48.current = (NodeBase *)pSVar10;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      uVar9 = (ulong)(byte)local_34;
      while( true ) {
        if (pSVar10 == (SList<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
          pSVar10 = (SList<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
        }
        local_48.current =
             (pSVar10->super_SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
        if ((SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
            local_48.list) break;
        pppLVar8 = SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             (&local_48);
        pSVar10 = (SList<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
        if ((*pppLVar8)[uVar9] == lifetime) {
          (*pppLVar8)[uVar9] = (Lifetime *)0x0;
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool LinearScan::ClearLoopExitIfRegUnused(Lifetime *lifetime, RegNum reg, IR::BranchInstr *branchInstr, Loop *loop)
{
    // If a lifetime was enregistered into the loop and then spilled, we need compensation at the bottom
    // of the loop to reload the lifetime into that register.
    // If that lifetime was spilled before it was ever used, we don't need the compensation code.
    // We do however need to clear the regContent on any loop exit as the register will not
    // be available anymore on that path.
    // Note: If the lifetime was reloaded into the same register, we might clear the regContent unnecessarily...
    if (!PHASE_OFF(Js::ClearRegLoopExitPhase, this->func))
    {
        return false;
    }
    if (!loop->regAlloc.symRegUseBv->Test(lifetime->sym->m_id) && !lifetime->needsStoreCompensation)
    {
        if (lifetime->end > branchInstr->GetNumber())
        {
            FOREACH_SLIST_ENTRY(Lifetime **, regContent, loop->regAlloc.exitRegContentList)
            {
                if (regContent[reg] == lifetime)
                {
                    regContent[reg] = nullptr;
                }
            } NEXT_SLIST_ENTRY;
        }
        return true;
    }

    return false;
}